

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-parser.cc
# Opt level: O2

string * __thiscall
elf_parser::Elf_parser::get_symbol_index_abi_cxx11_
          (string *__return_storage_ptr__,Elf_parser *this,uint16_t *sym_idx)

{
  allocator *paVar1;
  uint __val;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (*sym_idx == 0) {
    pcVar2 = "UND";
    paVar1 = &local_b;
  }
  else {
    __val = (uint)*sym_idx;
    if (__val == 0xffff) {
      pcVar2 = "COM";
      paVar1 = &local_c;
    }
    else if (__val == 0xfff2) {
      pcVar2 = "COM";
      paVar1 = &local_a;
    }
    else {
      if (__val != 0xfff1) {
        std::__cxx11::to_string(__return_storage_ptr__,__val);
        return __return_storage_ptr__;
      }
      pcVar2 = "ABS";
      paVar1 = &local_9;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Elf_parser::get_symbol_index(uint16_t &sym_idx) {
    switch(sym_idx) {
        case SHN_ABS: return "ABS";
        case SHN_COMMON: return "COM";
        case SHN_UNDEF: return "UND";
        case SHN_XINDEX: return "COM";
        default: return std::to_string(sym_idx);
    }
}